

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexOpen(Fts5Config *pConfig,int bCreate,Fts5Index **pp,char **pzErr)

{
  Fts5Index *p_00;
  char *pcVar1;
  Fts5Index *p;
  char **ppcStack_28;
  int rc;
  char **pzErr_local;
  Fts5Index **pp_local;
  Fts5Config *pFStack_10;
  int bCreate_local;
  Fts5Config *pConfig_local;
  
  p._4_4_ = 0;
  ppcStack_28 = pzErr;
  pzErr_local = (char **)pp;
  pp_local._4_4_ = bCreate;
  pFStack_10 = pConfig;
  p_00 = (Fts5Index *)sqlite3Fts5MallocZero((int *)((long)&p + 4),0x88);
  *pzErr_local = (char *)p_00;
  if (p._4_4_ == 0) {
    p_00->pConfig = pFStack_10;
    p_00->nWorkUnit = 0x40;
    pcVar1 = sqlite3Fts5Mprintf((int *)((long)&p + 4),"%s_data",pFStack_10->zName);
    p_00->zDataTbl = pcVar1;
    if ((p_00->zDataTbl != (char *)0x0) && (pp_local._4_4_ != 0)) {
      p._4_4_ = sqlite3Fts5CreateTable
                          (pFStack_10,"data","id INTEGER PRIMARY KEY, block BLOB",0,ppcStack_28);
      if (p._4_4_ == 0) {
        p._4_4_ = sqlite3Fts5CreateTable
                            (pFStack_10,"idx","segid, term, pgno, PRIMARY KEY(segid, term)",1,
                             ppcStack_28);
      }
      if (p._4_4_ == 0) {
        p._4_4_ = sqlite3Fts5IndexReinit(p_00);
      }
    }
  }
  if (p._4_4_ != 0) {
    sqlite3Fts5IndexClose(p_00);
    *pzErr_local = (char *)0x0;
  }
  return p._4_4_;
}

Assistant:

static int sqlite3Fts5IndexOpen(
  Fts5Config *pConfig, 
  int bCreate, 
  Fts5Index **pp,
  char **pzErr
){
  int rc = SQLITE_OK;
  Fts5Index *p;                   /* New object */

  *pp = p = (Fts5Index*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5Index));
  if( rc==SQLITE_OK ){
    p->pConfig = pConfig;
    p->nWorkUnit = FTS5_WORK_UNIT;
    p->zDataTbl = sqlite3Fts5Mprintf(&rc, "%s_data", pConfig->zName);
    if( p->zDataTbl && bCreate ){
      rc = sqlite3Fts5CreateTable(
          pConfig, "data", "id INTEGER PRIMARY KEY, block BLOB", 0, pzErr
      );
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts5CreateTable(pConfig, "idx", 
            "segid, term, pgno, PRIMARY KEY(segid, term)", 
            1, pzErr
        );
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3Fts5IndexReinit(p);
      }
    }
  }

  assert( rc!=SQLITE_OK || p->rc==SQLITE_OK );
  if( rc ){
    sqlite3Fts5IndexClose(p);
    *pp = 0;
  }
  return rc;
}